

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_features.c
# Opt level: O0

void cpu_check_features(cpu_features *features)

{
  void *in_RDI;
  x86_cpu_features *in_stack_00000020;
  
  memset(in_RDI,0,0x3c);
  x86_check_features(in_stack_00000020);
  return;
}

Assistant:

Z_INTERNAL void cpu_check_features(struct cpu_features *features) {
    memset(features, 0, sizeof(struct cpu_features));
#if defined(X86_FEATURES)
    x86_check_features(&features->x86);
#elif defined(ARM_FEATURES)
    arm_check_features(&features->arm);
#elif defined(PPC_FEATURES) || defined(POWER_FEATURES)
    power_check_features(&features->power);
#elif defined(S390_FEATURES)
    s390_check_features(&features->s390);
#elif defined(RISCV_FEATURES)
    riscv_check_features(&features->riscv);
#endif
}